

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_set_icc(LodePNGInfo *info,char *name,uchar *profile,uint profile_size)

{
  uint uVar1;
  undefined4 in_ECX;
  LodePNGInfo *in_RDX;
  long in_RDI;
  uchar *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (*(long *)(in_RDI + 0xf0) != 0) {
    lodepng_clear_icc((LodePNGInfo *)0x106520);
  }
  uVar1 = lodepng_assign_icc(in_RDX,(char *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                             in_stack_ffffffffffffffd8,0);
  return uVar1;
}

Assistant:

unsigned lodepng_set_icc(LodePNGInfo* info, const char* name, const unsigned char* profile, unsigned profile_size) {
  if(info->iccp_name) lodepng_clear_icc(info);

  return lodepng_assign_icc(info, name, profile, profile_size);
}